

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<char_const(&)[25],kj::StringPtr&,char_const(&)[32],unsigned_int&,char_const(&)[26],kj::StringPtr&,kj::String&,char_const(&)[4]>
          (String *__return_storage_ptr__,kj *this,char (*params) [25],StringPtr *params_1,
          char (*params_2) [32],uint *params_3,char (*params_4) [26],StringPtr *params_5,
          String *params_6,char (*params_7) [4])

{
  char *pcVar1;
  ArrayPtr<const_char> *params_7_00;
  ArrayPtr<const_char> local_b8;
  undefined1 local_a8 [16];
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  kj *local_78;
  size_t local_70;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_70 = strlen((char *)this);
  local_88.ptr = *(char **)*params;
  local_88.size_ = *(long *)(*params + 8) - 1;
  local_78 = this;
  local_98.size_ = strlen((char *)params_1);
  local_98.ptr = (char *)params_1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)*params_2);
  local_a8._8_8_ = strlen((char *)params_3);
  local_b8.ptr = *(char **)*params_4;
  local_b8.size_ = *(long *)(*params_4 + 8) - 1;
  pcVar1 = (char *)(params_5->content).size_;
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = (params_5->content).ptr;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  params_7_00 = (ArrayPtr<const_char> *)0x188ddf;
  local_a8._0_8_ = params_3;
  local_68.size_ = strlen((char *)params_6);
  local_68.ptr = (char *)params_6;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_78,&local_88,&local_98,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)local_a8,&local_b8,
             &local_58,&local_68,params_7_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}